

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_0::CWriter::WriteSignedBinaryExpr(CWriter *this,Opcode opcode,char *op)

{
  size_t size;
  Newline *in_RCX;
  Opcode local_7c;
  Info local_78;
  
  local_7c.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_78,&local_7c);
  Opcode::GetInfo(&local_78,&local_7c);
  Opcode::GetInfo(&local_78,&local_7c);
  if (local_78.param_types[1].enum_ == local_78.param_types[0].enum_) {
    Write(this,(StackVar *)0x1);
    WriteData(this," = (",4);
    Write(this,local_78.param_types[0]);
    WriteData(this,")((",3);
    Write(this,(SignedType)local_78.param_types[0]);
    WriteData(this,")",1);
    Write(this,(StackVar *)0x1);
    WriteData(this," ",1);
    size = strlen(op);
    WriteData(this,op,size);
    WriteData(this," (",2);
    Write(this,(SignedType)local_78.param_types[0]);
    WriteData(this,")",1);
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(StackVar *)0x0,(char (*) [3])0xffffffff00000000,in_RCX);
    DropTypes(this,2);
    PushType(this,local_78.result_type);
    return;
  }
  __assert_fail("opcode.GetParamType2() == type",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                ,0xcbf,
                "void wabt::(anonymous namespace)::CWriter::WriteSignedBinaryExpr(Opcode, const char *)"
               );
}

Assistant:

void CWriter::WriteSignedBinaryExpr(Opcode opcode, const char* op) {
  Type result_type = opcode.GetResultType();
  Type type = opcode.GetParamType1();
  assert(opcode.GetParamType2() == type);
  Write(StackVar(1, result_type), " = (", type, ")((", SignedType(type), ")",
        StackVar(1), " ", op, " (", SignedType(type), ")", StackVar(0), ");",
        Newline());
  DropTypes(2);
  PushType(result_type);
}